

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswIslands.c
# Opt level: O1

Vec_Int_t * Ssw_MatchingMiter(Aig_Man_t *pMiter,Aig_Man_t *p0,Aig_Man_t *p1,Vec_Int_t *vPairsAll)

{
  Vec_Ptr_t *pVVar1;
  int *piVar2;
  Vec_Int_t *p;
  int *piVar3;
  void *pvVar4;
  ulong uVar5;
  uint uVar6;
  void *pvVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  
  iVar12 = p0->vObjs->nSize - p0->nDeleted;
  p = (Vec_Int_t *)malloc(0x10);
  iVar9 = 0x10;
  if (0xe < iVar12 * 2 - 1U) {
    iVar9 = iVar12 * 2;
  }
  p->nSize = 0;
  p->nCap = iVar9;
  if (iVar9 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar9 << 2);
  }
  p->pArray = piVar3;
  iVar9 = vPairsAll->nSize;
  if (0 < iVar9) {
    lVar8 = 1;
    do {
      pVVar1 = p0->vObjs;
      if (pVVar1 == (Vec_Ptr_t *)0x0) {
        pvVar4 = (void *)0x0;
      }
      else {
        uVar6 = vPairsAll->pArray[lVar8 + -1];
        if (((int)uVar6 < 0) || (pVVar1->nSize <= (int)uVar6)) goto LAB_005e66fd;
        pvVar4 = pVVar1->pArray[uVar6];
      }
      if (iVar9 <= lVar8) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      pVVar1 = p1->vObjs;
      if (pVVar1 == (Vec_Ptr_t *)0x0) {
        pvVar7 = (void *)0x0;
      }
      else {
        uVar6 = vPairsAll->pArray[lVar8];
        if (((int)uVar6 < 0) || (pVVar1->nSize <= (int)uVar6)) {
LAB_005e66fd:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar7 = pVVar1->pArray[uVar6];
      }
      piVar3 = *(int **)((long)pvVar4 + 0x28);
      if (piVar3 == (int *)0x0) {
        __assert_fail("pObj0->pData != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswIslands.c"
                      ,0x17d,
                      "Vec_Int_t *Ssw_MatchingMiter(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)"
                     );
      }
      piVar2 = *(int **)((long)pvVar7 + 0x28);
      if (piVar2 == (int *)0x0) {
        __assert_fail("pObj1->pData != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswIslands.c"
                      ,0x17e,
                      "Vec_Int_t *Ssw_MatchingMiter(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)"
                     );
      }
      if (piVar3 != piVar2) {
        uVar10 = *(ulong *)(piVar3 + 6) & 7;
        if (uVar10 != 0) {
          uVar5 = *(ulong *)(piVar2 + 6) & 7;
          if (uVar5 != 0) {
            if (((ulong)piVar3 & 1) != 0) {
              __assert_fail("!Aig_IsComplement(pObj0)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswIslands.c"
                            ,0x186,
                            "Vec_Int_t *Ssw_MatchingMiter(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)"
                           );
            }
            if (((ulong)piVar2 & 1) != 0) {
              __assert_fail("!Aig_IsComplement(pObj1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswIslands.c"
                            ,0x187,
                            "Vec_Int_t *Ssw_MatchingMiter(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)"
                           );
            }
            uVar11 = (uint)*(ulong *)(piVar3 + 6) & 7;
            uVar6 = (uint)*(ulong *)(piVar2 + 6) & 7;
            if (uVar11 != uVar6) {
              __assert_fail("Aig_ObjType(pObj0) == Aig_ObjType(pObj1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswIslands.c"
                            ,0x188,
                            "Vec_Int_t *Ssw_MatchingMiter(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)"
                           );
            }
            iVar9 = (int)uVar10;
            if (iVar9 != 3) {
              if ((uVar11 - 7 < 0xfffffffe) && ((iVar9 != 2 || (*piVar3 < pMiter->nTruePis)))) {
                __assert_fail("Aig_ObjIsNode(pObj0) || Saig_ObjIsLo(pMiter, pObj0)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswIslands.c"
                              ,0x18b,
                              "Vec_Int_t *Ssw_MatchingMiter(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)"
                             );
              }
              if ((uVar6 - 7 < 0xfffffffe) && (((int)uVar5 != 2 || (*piVar2 < pMiter->nTruePis)))) {
                __assert_fail("Aig_ObjIsNode(pObj1) || Saig_ObjIsLo(pMiter, pObj1)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswIslands.c"
                              ,0x18c,
                              "Vec_Int_t *Ssw_MatchingMiter(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)"
                             );
              }
              if (piVar2[9] <= piVar3[9]) {
                __assert_fail("pObj0->Id < pObj1->Id",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswIslands.c"
                              ,0x18d,
                              "Vec_Int_t *Ssw_MatchingMiter(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)"
                             );
              }
              Vec_IntPush(p,piVar3[9]);
              Vec_IntPush(p,piVar2[9]);
            }
          }
        }
      }
      iVar9 = vPairsAll->nSize;
      iVar12 = (int)lVar8;
      lVar8 = lVar8 + 2;
    } while (iVar12 + 1 < iVar9);
  }
  return p;
}

Assistant:

Vec_Int_t * Ssw_MatchingMiter( Aig_Man_t * pMiter, Aig_Man_t * p0, Aig_Man_t * p1, Vec_Int_t * vPairsAll )
{
    Vec_Int_t * vPairsMiter;
    Aig_Obj_t * pObj0, * pObj1;
    int i;
    // create matching of nodes in the miter
    vPairsMiter = Vec_IntAlloc( 2*Aig_ManObjNum(p0) );
    for ( i = 0; i < Vec_IntSize(vPairsAll); i += 2 )
    {
        pObj0 = Aig_ManObj( p0, Vec_IntEntry(vPairsAll, i) );
        pObj1 = Aig_ManObj( p1, Vec_IntEntry(vPairsAll, i+1) );
        assert( pObj0->pData != NULL );
        assert( pObj1->pData != NULL );
        if ( pObj0->pData == pObj1->pData )
            continue;
        if ( Aig_ObjIsNone((Aig_Obj_t *)pObj0->pData) || Aig_ObjIsNone((Aig_Obj_t *)pObj1->pData) )
            continue;
        // get the miter nodes
        pObj0 = (Aig_Obj_t *)pObj0->pData;
        pObj1 = (Aig_Obj_t *)pObj1->pData;
        assert( !Aig_IsComplement(pObj0) );
        assert( !Aig_IsComplement(pObj1) );
        assert( Aig_ObjType(pObj0) == Aig_ObjType(pObj1) );
        if ( Aig_ObjIsCo(pObj0) )
            continue;
        assert( Aig_ObjIsNode(pObj0) || Saig_ObjIsLo(pMiter, pObj0) );
        assert( Aig_ObjIsNode(pObj1) || Saig_ObjIsLo(pMiter, pObj1) );
        assert( pObj0->Id < pObj1->Id );
        Vec_IntPush( vPairsMiter, pObj0->Id );
        Vec_IntPush( vPairsMiter, pObj1->Id );
    }
    return vPairsMiter;
}